

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O0

object_ptr __thiscall
mjs::make_accessor_object(mjs *this,gc_heap_ptr<mjs::global_object> *global,value *get,value *set)

{
  value_type vVar1;
  gc_heap_ptr_untyped *pgVar2;
  global_object *pgVar3;
  gc_heap *args;
  object *poVar4;
  undefined8 extraout_RDX;
  bool bVar5;
  object_ptr oVar6;
  bool local_cb;
  bool local_ca;
  bool local_c9;
  bool local_b1;
  value local_b0;
  string local_88;
  string local_78;
  string local_68 [2];
  undefined8 local_48;
  string local_40;
  undefined1 local_29;
  value *local_28;
  value *set_local;
  value *get_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  gc_heap_ptr<mjs::object> *a;
  
  local_28 = set;
  set_local = get;
  get_local = (value *)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)this;
  vVar1 = value::type(get);
  local_b1 = true;
  if (vVar1 != undefined) {
    vVar1 = value::type(set_local);
    local_c9 = false;
    if (vVar1 == object) {
      pgVar2 = &value::object_value(set_local)->super_gc_heap_ptr_untyped;
      local_c9 = gc_heap_ptr_untyped::has_type<mjs::function_object>(pgVar2);
    }
    local_b1 = local_c9;
  }
  if (local_b1 == false) {
    __assert_fail("get.type() == value_type::undefined || (get.type() == value_type::object && get.object_value().has_type<function_object>())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                  ,0xb,
                  "object_ptr mjs::make_accessor_object(const gc_heap_ptr<global_object> &, const value &, const value &)"
                 );
  }
  vVar1 = value::type(local_28);
  local_ca = true;
  if (vVar1 != undefined) {
    vVar1 = value::type(local_28);
    local_cb = false;
    if (vVar1 == object) {
      pgVar2 = &value::object_value(local_28)->super_gc_heap_ptr_untyped;
      local_cb = gc_heap_ptr_untyped::has_type<mjs::function_object>(pgVar2);
    }
    local_ca = local_cb;
  }
  if (local_ca != false) {
    vVar1 = value::type(set_local);
    bVar5 = true;
    if (vVar1 == undefined) {
      vVar1 = value::type(local_28);
      bVar5 = vVar1 != undefined;
    }
    if (bVar5) {
      local_29 = 0;
      pgVar3 = gc_heap_ptr<mjs::global_object>::operator->
                         ((gc_heap_ptr<mjs::global_object> *)get_local);
      args = object::heap(&pgVar3->super_object);
      pgVar3 = gc_heap_ptr<mjs::global_object>::operator->
                         ((gc_heap_ptr<mjs::global_object> *)get_local);
      (*(pgVar3->super_object)._vptr_object[0x13])(&local_40,pgVar3,"Accessor");
      local_48 = 0;
      gc_heap::make<mjs::object,mjs::string,decltype(nullptr)>
                ((gc_heap *)this,(string *)args,(void **)&local_40);
      string::~string(&local_40);
      poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)this);
      pgVar3 = gc_heap_ptr<mjs::global_object>::operator->
                         ((gc_heap_ptr<mjs::global_object> *)get_local);
      (*(pgVar3->super_object)._vptr_object[0x13])(local_68,pgVar3,"get");
      (*poVar4->_vptr_object[1])(poVar4,local_68,set_local,0);
      string::~string(local_68);
      poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)this);
      pgVar3 = gc_heap_ptr<mjs::global_object>::operator->
                         ((gc_heap_ptr<mjs::global_object> *)get_local);
      (*(pgVar3->super_object)._vptr_object[0x13])(&local_78,pgVar3,"set");
      (*poVar4->_vptr_object[1])(poVar4,&local_78,local_28,0);
      string::~string(&local_78);
      poVar4 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)this);
      pgVar3 = gc_heap_ptr<mjs::global_object>::operator->
                         ((gc_heap_ptr<mjs::global_object> *)get_local);
      (*(pgVar3->super_object)._vptr_object[0x13])(&local_88,pgVar3,"__strict__");
      pgVar3 = gc_heap_ptr<mjs::global_object>::operator->
                         ((gc_heap_ptr<mjs::global_object> *)get_local);
      bVar5 = global_object::strict_mode(pgVar3);
      value::value(&local_b0,bVar5);
      (*poVar4->_vptr_object[1])(poVar4,&local_88,&local_b0,0);
      value::~value(&local_b0);
      string::~string(&local_88);
      oVar6.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
      oVar6.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
      return (object_ptr)oVar6.super_gc_heap_ptr_untyped;
    }
    __assert_fail("get.type() != value_type::undefined || set.type() != value_type::undefined",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                  ,0xd,
                  "object_ptr mjs::make_accessor_object(const gc_heap_ptr<global_object> &, const value &, const value &)"
                 );
  }
  __assert_fail("set.type() == value_type::undefined || (set.type() == value_type::object && set.object_value().has_type<function_object>())"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                ,0xc,
                "object_ptr mjs::make_accessor_object(const gc_heap_ptr<global_object> &, const value &, const value &)"
               );
}

Assistant:

object_ptr make_accessor_object(const gc_heap_ptr<global_object>& global, const value& get, const value& set) {
    assert(get.type() == value_type::undefined || (get.type() == value_type::object && get.object_value().has_type<function_object>()));
    assert(set.type() == value_type::undefined || (set.type() == value_type::object && set.object_value().has_type<function_object>()));
    assert(get.type() != value_type::undefined || set.type() != value_type::undefined);

    auto a = global->heap().make<object>(global->common_string("Accessor"), nullptr);
    a->put(global->common_string("get"), get);
    a->put(global->common_string("set"), set);
    a->put(global->common_string("__strict__"), value{global->strict_mode()}); // Hack
    return a;
}